

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

void __thiscall HEkkDualRow::choosePossible(HEkkDualRow *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference this_00;
  long *in_RDI;
  double dVar4;
  pair<int,_double> pVar5;
  double relax;
  double alpha;
  HighsInt move;
  HighsInt iCol;
  HighsInt i;
  HighsInt move_out;
  double Td;
  double Ta;
  double *in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  int *local_58;
  pair<int,_double> local_40;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  double local_18;
  int *local_10;
  
  if (*(int *)(*in_RDI + 0x2944) < 10) {
    local_58 = (int *)0x3e112e0be826d695;
  }
  else {
    in_stack_ffffffffffffff98 = (double *)0x3eb0c6f7a0b5ed8d;
    in_stack_ffffffffffffffa0 = (int *)0x3e601b2b29a4692b;
    local_58 = in_stack_ffffffffffffffa0;
    if (0x13 < *(int *)(*in_RDI + 0x2944)) {
      in_stack_ffffffffffffffa0 = (int *)0x3eb0c6f7a0b5ed8d;
      local_58 = in_stack_ffffffffffffffa0;
    }
  }
  local_10 = local_58;
  local_18 = *(double *)(*(long *)(*in_RDI + 8) + 0x120);
  local_1c = 1;
  if ((double)in_RDI[0x15] < 0.0) {
    local_1c = -1;
  }
  in_RDI[0x17] = 0x7ff0000000000000;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0;
  for (local_20 = 0; local_20 < (int)in_RDI[0xd]; local_20 = local_20 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_20);
    local_24 = *pvVar2;
    local_28 = (int)*(char *)(in_RDI[3] + (long)local_24);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x11),(long)local_20);
    local_30 = *pvVar3 * (double)local_1c * (double)local_28;
    if ((double)local_10 < local_30) {
      pVar5 = std::make_pair<int_const&,double_const&>
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      local_40.second = pVar5.second;
      local_40.first = pVar5.first;
      iVar1 = *(int *)((long)in_RDI + 0xc4);
      *(int *)((long)in_RDI + 0xc4) = iVar1 + 1;
      this_00 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                            *)(in_RDI + 0x19),(long)iVar1);
      std::pair<int,_double>::operator=(this_00,&local_40);
      dVar4 = *(double *)(in_RDI[4] + (long)local_24 * 8) * (double)local_28 + local_18;
      if (dVar4 < (double)in_RDI[0x17] * local_30) {
        in_RDI[0x17] = (long)(dVar4 / local_30);
      }
    }
  }
  return;
}

Assistant:

void HEkkDualRow::choosePossible() {
  /**
   * Determine the possible variables - candidates for CHUZC
   * TODO: Check with Qi what this is doing
   */
  const double Ta = ekk_instance_.info_.update_count < 10   ? 1e-9
                    : ekk_instance_.info_.update_count < 20 ? 3e-8
                                                            : 1e-6;
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  const HighsInt move_out = workDelta < 0 ? -1 : 1;
  workTheta = kHighsInf;
  workCount = 0;

  for (HighsInt i = 0; i < packCount; i++) {
    const HighsInt iCol = packIndex[i];
    const HighsInt move = workMove[iCol];
    const double alpha = packValue[i] * move_out * move;
    if (alpha > Ta) {
      workData[workCount++] = make_pair(iCol, alpha);
      const double relax = workDual[iCol] * move + Td;
      if (workTheta * alpha > relax) workTheta = relax / alpha;
    }
  }
}